

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Performance::anon_unknown_1::UploadWaitDrawCase::checkSampleTemporalStability
          (UploadWaitDrawCase *this,offset_in_Result_to_deUint64 target,char *description)

{
  int iVar1;
  undefined8 uVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  float *pfVar6;
  reference pvVar7;
  TestLog *this_00;
  MessageBuilder *pMVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float local_248;
  MessageBuilder local_218;
  undefined1 local_98 [24];
  float local_80;
  int local_7c;
  undefined1 auStack_78 [4];
  int ndx;
  LineParametersWithConfidence lineFit;
  allocator<tcu::Vector<float,_2>_> local_49;
  undefined1 local_48 [8];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> dataPoints;
  char *pcStack_28;
  int numDataPoints;
  char *description_local;
  offset_in_Result_to_deUint64 target_local;
  UploadWaitDrawCase *this_local;
  
  pcStack_28 = description;
  description_local = (char *)target;
  target_local = (offset_in_Result_to_deUint64)this;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->m_iterationOrder);
  dataPoints.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar3;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->m_iterationOrder);
  std::allocator<tcu::Vector<float,_2>_>::allocator(&local_49);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_48,
             sVar3,&local_49);
  std::allocator<tcu::Vector<float,_2>_>::~allocator(&local_49);
  for (local_7c = 0; iVar1 = local_7c,
      sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->m_iterationOrder),
      iVar1 < (int)sVar3; local_7c = local_7c + 1) {
    fVar9 = (float)local_7c;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->m_iterationOrder,(long)local_7c);
    pvVar5 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                        local_48,(long)*pvVar4);
    pfVar6 = tcu::Vector<float,_2>::x(pvVar5);
    *pfVar6 = fVar9;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->m_iterationOrder,(long)local_7c);
    pvVar7 = std::
             vector<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
             ::operator[](&this->m_results,(long)*pvVar4);
    local_248 = (float)*(ulong *)(description_local + (long)&pvVar7->uploadDuration);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->m_iterationOrder,(long)local_7c);
    pvVar5 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                        local_48,(long)*pvVar4);
    pfVar6 = tcu::Vector<float,_2>::y(pvVar5);
    *pfVar6 = local_248;
  }
  deqp::gls::theilSenSiegelLinearRegression
            ((LineParametersWithConfidence *)local_98,
             (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_48,0.6)
  ;
  auStack_78 = (undefined1  [4])local_98._0_4_;
  ndx = local_98._4_4_;
  lineFit.offset = (float)local_98._8_4_;
  lineFit.offsetConfidenceUpper = (float)local_98._12_4_;
  uVar2 = lineFit._0_8_;
  lineFit.offsetConfidenceLower = (float)local_98._16_4_;
  lineFit.coefficient = (float)local_98._20_4_;
  lineFit.coefficientConfidenceUpper = local_80;
  lineFit.offsetConfidenceUpper = SUB84(local_98._8_8_,4);
  fVar9 = lineFit.offsetConfidenceUpper;
  lineFit._0_8_ = uVar2;
  fVar9 = de::abs<float>(fVar9);
  fVar11 = (float)dataPoints.
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  fVar10 = de::abs<float>((float)auStack_78);
  this_local._7_1_ = fVar9 * fVar11 <= fVar10 * 0.25;
  if (!(bool)this_local._7_1_) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_218,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_218,&stack0xffffffffffffffd8);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (pMVar8,(char (*) [135])
                               ": Correlation with data point observation order and result time. Results are not temporally stable, observations are not independent.\n"
                       );
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [15])"\tCoefficient: ");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&lineFit.offsetConfidenceUpper);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [21])" (us / observation)\n");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_218);
  }
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool UploadWaitDrawCase::checkSampleTemporalStability (deUint64 (UploadWaitDrawCase::Result::*target), const char* description)
{
	// Try to find correlation with sample order and sample times

	const int						numDataPoints	= (int)m_iterationOrder.size();
	std::vector<tcu::Vec2>			dataPoints		(m_iterationOrder.size());
	LineParametersWithConfidence	lineFit;

	for (int ndx = 0; ndx < (int)m_iterationOrder.size(); ++ndx)
	{
		dataPoints[m_iterationOrder[ndx]].x() = (float)ndx;
		dataPoints[m_iterationOrder[ndx]].y() = (float)(m_results[m_iterationOrder[ndx]].*target);
	}

	lineFit = theilSenSiegelLinearRegression(dataPoints, 0.6f);

	// Difference of more than 25% of the offset along the whole sample range
	if (de::abs(lineFit.coefficient) * (float)numDataPoints > de::abs(lineFit.offset) * 0.25f)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< description << ": Correlation with data point observation order and result time. Results are not temporally stable, observations are not independent.\n"
			<< "\tCoefficient: " << lineFit.coefficient << " (us / observation)\n"
			<< tcu::TestLog::EndMessage;

		return false;
	}
	else
		return true;
}